

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_diag_m2(REF_DBL *m,REF_DBL *d)

{
  REF_DBL RVar1;
  REF_STATUS RVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (0x7fefffffffffffff < (ulong)ABS(*m)) {
    return 3;
  }
  RVar1 = m[1];
  if (0x7fefffffffffffff < (ulong)ABS(RVar1)) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[2])) {
    return 3;
  }
  auVar5._0_8_ = (*m - m[2]) * 0.5;
  auVar5._8_8_ = RVar1;
  auVar15._0_8_ = -auVar5._0_8_;
  auVar15._8_8_ = -RVar1;
  auVar14._8_8_ = RVar1;
  auVar14._0_8_ = auVar5._0_8_;
  auVar15 = maxpd(auVar14,auVar15);
  dVar8 = auVar15._0_8_;
  dVar13 = auVar15._8_8_;
  dVar12 = dVar8;
  if (dVar8 <= dVar13) {
    dVar12 = dVar13;
  }
  dVar11 = dVar12 * 1e+20;
  if (dVar11 <= -dVar11) {
    dVar11 = -dVar11;
  }
  auVar6 = ZEXT816(0xbff0000000000000);
  if ((dVar11 <= dVar8) || (dVar11 <= dVar13)) {
LAB_0017128a:
    dVar12 = (1.0 - auVar6._0_8_) * 0.5;
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    dVar8 = (auVar6._8_8_ * 0.5) / dVar12;
    dVar13 = m[1] * auVar6._8_8_;
    *d = *m * dVar12 * dVar12 + (m[2] * dVar8 * dVar8 - dVar13);
    d[1] = dVar12 * dVar12 * m[2] + dVar8 * dVar8 * *m + dVar13;
    d[2] = dVar12;
    d[3] = -dVar8;
    d[4] = dVar8;
    d[5] = dVar12;
    RVar2 = 0;
  }
  else {
    auVar9._8_8_ = dVar12;
    auVar9._0_8_ = dVar12;
    auVar5 = divpd(auVar5,auVar9);
    dVar8 = auVar5._0_8_;
    dVar13 = auVar5._8_8_;
    auVar10._0_8_ = SQRT(dVar8 * dVar8 + dVar13 * dVar13);
    dVar12 = auVar10._0_8_ * 1e+20;
    if (dVar12 <= -dVar12) {
      dVar12 = -dVar12;
    }
    if (dVar8 <= -dVar8) {
      dVar8 = -dVar8;
    }
    if (dVar12 <= dVar8) {
      pcVar4 = "c2/l";
      uVar3 = 0x115;
    }
    else {
      if (dVar13 <= -dVar13) {
        dVar13 = -dVar13;
      }
      if (dVar13 < dVar12) {
        auVar10._8_8_ = auVar10._0_8_;
        auVar6 = divpd(auVar5,auVar10);
        if (0.0 < auVar6._0_8_) {
          uVar7 = auVar6._8_8_;
          auVar6._0_8_ = -auVar6._0_8_;
          auVar6._8_8_ = uVar7 ^ 0x8000000000000000;
        }
        goto LAB_0017128a;
      }
      pcVar4 = "s2/l";
      uVar3 = 0x116;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",uVar3,
           "ref_matrix_diag_m2",pcVar4);
    RVar2 = 1;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m2(REF_DBL *m, REF_DBL *d) {
  REF_DBL c2, s2, norm, l, c, s, cc, ss, mid;
  /* if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2])) {
    return REF_INVALID;
  }

  /* one rotation ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/ */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  c2 = 0.5 * (m[0] - m[2]);
  s2 = m[1];
  norm = MAX(ABS(c2), ABS(s2));

  if (ref_math_divisible(c2, norm) && ref_math_divisible(s2, norm)) {
    c2 /= norm;
    s2 /= norm;
    l = sqrt(c2 * c2 + s2 * s2);
    RAS(ref_math_divisible(c2, l), "c2/l");
    RAS(ref_math_divisible(s2, l), "s2/l");
    c2 /= l;
    s2 /= l;
    if (c2 > 0.0) {
      c2 = -c2;
      s2 = -s2;
    }
  } else {
    c2 = -1.0;
    s2 = 0.0;
  }

  s = sqrt(0.5 * (1.0 - c2));
  c = 0.5 * s2 / s;
  cc = c * c;
  ss = s * s;
  mid = s2 * m[1];

  /*
  printf("  m00 %f m01 %f m11 %f\n", m[0], m[1], m[2]);
  printf("  c2 %f s2 %f c %f s %f\n", c2, s2, c, s);
  printf("  cc %f ss %f mid %f\n", cc, ss, mid);
  printf("  e %f %f %f e %f %f %f\n", cc * m[2], -mid, ss * m[0], cc * m[0],
         mid, ss * m[2]);
  printf("  e %f e %f\n", cc * m[2] - mid + ss * m[0],
         cc * m[0] + mid + ss * m[2]);
  */

  ref_matrix_eig2(d, 0) = cc * m[2] - mid + ss * m[0];
  ref_matrix_eig2(d, 1) = cc * m[0] + mid + ss * m[2];

  ref_matrix_vec2(d, 0, 0) = s;
  ref_matrix_vec2(d, 1, 0) = -c;

  ref_matrix_vec2(d, 0, 1) = c;
  ref_matrix_vec2(d, 1, 1) = s;

  return REF_SUCCESS;
}